

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_group.c
# Opt level: O2

UnshieldFileGroup * unshield_file_group_new(Header *header,uint32_t offset)

{
  uint uVar1;
  uint32_t uVar2;
  undefined8 in_RAX;
  UnshieldFileGroup *pUVar3;
  uint32_t *puVar4;
  char *pcVar5;
  uint32_t *puVar6;
  undefined4 uVar7;
  
  uVar7 = (undefined4)((ulong)in_RAX >> 0x20);
  pUVar3 = (UnshieldFileGroup *)calloc(1,0x10);
  puVar4 = (uint32_t *)unshield_header_get_buffer(header,offset);
  _unshield_log(3,"unshield_file_group_new",0xe,"File group descriptor offset: %08x",offset);
  pcVar5 = unshield_header_get_string(header,*puVar4);
  pUVar3->name = pcVar5;
  puVar6 = puVar4 + 0x13;
  if (5 < header->major_version) {
    puVar6 = (uint32_t *)((long)puVar4 + 0x16);
  }
  uVar1 = *puVar6;
  pUVar3->first_file = uVar1;
  uVar2 = puVar6[1];
  pUVar3->last_file = uVar2;
  _unshield_log(3,"unshield_file_group_new",0x1d,"File group %08x first file = %i, last file = %i",
                offset,(ulong)uVar1,CONCAT44(uVar7,uVar2));
  return pUVar3;
}

Assistant:

UnshieldFileGroup* unshield_file_group_new(Header* header, uint32_t offset)/*{{{*/
{
  UnshieldFileGroup* self = NEW1(UnshieldFileGroup);
  uint8_t* p = unshield_header_get_buffer(header, offset);

#if VERBOSE
  unshield_trace("File group descriptor offset: %08x", offset);
#endif

  self->name = unshield_header_get_string(header, READ_UINT32(p)); p += 4;

  if (header->major_version <= 5)
    p += 0x48;
  else
    p += 0x12;

  self->first_file = READ_UINT32(p); p += 4;
  self->last_file  = READ_UINT32(p); p += 4;

#if VERBOSE
  unshield_trace("File group %08x first file = %i, last file = %i", 
      offset, self->first_file, self->last_file);
#endif

  return self;
}